

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void c2mir_init(MIR_context_t ctx)

{
  c2m_ctx_t c2m_ctx;
  VARR_void_ptr_t *pVVar1;
  void_ptr_t *ppvVar2;
  char *message;
  _func_void_tab_str_t_void_ptr *in_R8;
  void *in_R9;
  str_t sVar3;
  
  c2m_ctx = (c2m_ctx_t)c2mir_calloc((c2m_ctx_t)0x0,0x208);
  message = &DAT_00000018;
  ctx->c2mir_ctx = (c2mir_ctx *)c2m_ctx;
  c2m_ctx->ctx = ctx;
  pVVar1 = (VARR_void_ptr_t *)malloc(0x18);
  c2m_ctx->reg_memory = pVVar1;
  if (pVVar1 != (VARR_void_ptr_t *)0x0) {
    pVVar1->els_num = 0;
    pVVar1->size = 0x1000;
    ppvVar2 = (void_ptr_t *)malloc(0x8000);
    pVVar1->varr = ppvVar2;
    HTAB_tab_str_t_create(&c2m_ctx->str_tab,1000,str_hash,str_eq,in_R8,in_R9);
    HTAB_tab_str_t_create(&c2m_ctx->str_key_tab,200,str_key_hash,str_key_eq,in_R8,in_R9);
    sVar3 = uniq_cstr(c2m_ctx,"");
    c2m_ctx->empty_str = sVar3;
    return;
  }
  mir_varr_error(message);
}

Assistant:

void c2mir_init (MIR_context_t ctx) {
  struct c2m_ctx **c2m_ctx_ptr = c2m_ctx_loc (ctx), *c2m_ctx;

  *c2m_ctx_ptr = c2m_ctx = c2mir_calloc (NULL, sizeof (struct c2m_ctx));
  c2m_ctx->ctx = ctx;
  reg_memory_init (c2m_ctx);
  str_init (c2m_ctx);
}